

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O3

void lower_named_interface_blocks(void *mem_ctx,gl_linked_shader *shader)

{
  undefined1 *puVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  exec_list *l;
  exec_node *peVar5;
  exec_node *peVar6;
  long *plVar7;
  exec_node *peVar8;
  char *pcVar9;
  hash_entry *phVar10;
  char *name;
  glsl_type *type;
  ir_variable *this;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  exec_node **ppeVar18;
  long lVar19;
  long lVar20;
  exec_node *peVar21;
  exec_node **ppeVar22;
  ulong uVar23;
  ir_hierarchical_visitor local_78;
  void *local_40;
  hash_table *local_38;
  
  ir_hierarchical_visitor::ir_hierarchical_visitor(&local_78);
  local_78._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_00256958;
  local_38 = (hash_table *)0x0;
  l = shader->ir;
  local_40 = mem_ctx;
  local_38 = _mesa_hash_table_create((void *)0x0,_mesa_hash_string,_mesa_key_string_equal);
  peVar5 = (l->head_sentinel).next;
  peVar8 = peVar5->next;
  if (peVar8 != (exec_node *)0x0) {
    ppeVar22 = &peVar5[-1].prev;
    while( true ) {
      peVar5 = peVar8->next;
      ppeVar18 = &peVar8[-1].prev;
      if (peVar5 == (exec_node *)0x0) {
        ppeVar18 = (exec_node **)0x0;
      }
      if (*(int *)(ppeVar22 + 3) == 7) {
        lVar20 = (long)ppeVar22[4];
        cVar2 = *(char *)(lVar20 + 4);
        lVar19 = lVar20;
        cVar3 = cVar2;
        while (cVar3 == '\x11') {
          lVar19 = *(long *)(lVar19 + 0x20);
          cVar3 = *(char *)(lVar19 + 4);
        }
        if (((exec_node *)lVar19 == ppeVar22[0x11]) &&
           (1 < (*(uint *)(ppeVar22 + 8) >> 0xc & 0xf) - 1)) {
          while (cVar2 == '\x11') {
            lVar20 = *(long *)(lVar20 + 0x20);
            cVar2 = *(char *)(lVar20 + 4);
          }
          if (cVar2 != '\x10') {
            __assert_fail("iface_t->is_interface()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_named_interface_blocks.cpp"
                          ,0x99,
                          "void (anonymous namespace)::flatten_named_interface_blocks_declarations::run(exec_list *)"
                         );
          }
          if (*(int *)(lVar20 + 0xc) != 0) {
            lVar19 = 0;
            uVar23 = 0;
            peVar8 = (exec_node *)(ppeVar22 + 1);
            do {
              pcVar9 = " out";
              if ((*(uint *)(ppeVar22 + 8) & 0xf000) == 0x4000) {
                pcVar9 = " in";
              }
              pcVar9 = ralloc_asprintf(local_40,"%s %s.%s.%s",pcVar9 + 1,
                                       *(undefined8 *)(lVar20 + 0x10),ppeVar22[5],
                                       *(undefined8 *)(*(long *)(lVar20 + 0x20) + 8 + lVar19));
              phVar10 = _mesa_hash_table_search(local_38,pcVar9);
              if ((phVar10 == (hash_entry *)0x0) || (peVar21 = peVar8, phVar10->data == (void *)0x0)
                 ) {
                name = ralloc_strdup(local_40,*(char **)(*(long *)(lVar20 + 0x20) + 8 + lVar19));
                if (((glsl_type *)ppeVar22[4])->field_0x4 == '\x11') {
                  type = process_array_type((glsl_type *)ppeVar22[4],(uint)uVar23);
                  this = (ir_variable *)exec_node::operator_new(0x90,local_40);
                  uVar4 = *(uint *)(ppeVar22 + 8);
                }
                else {
                  this = (ir_variable *)exec_node::operator_new(0x90,local_40);
                  type = *(glsl_type **)(*(long *)(lVar20 + 0x20) + lVar19);
                  uVar4 = *(uint *)(ppeVar22 + 8);
                }
                ir_variable::ir_variable
                          (this,type,name,uVar4 >> 0xc & (ir_var_mode_count|ir_var_shader_shared));
                uVar4 = *(uint *)(*(long *)(lVar20 + 0x20) + 0x10 + lVar19);
                (this->data).location = uVar4;
                uVar11 = ~uVar4 >> 0xd & 0x40000;
                uVar4 = *(uint *)&this->data;
                *(uint *)&this->data = uVar4 & 0xfffbffff | uVar11;
                (this->data).offset = *(uint *)(*(long *)(lVar20 + 0x20) + 0x14 + lVar19);
                uVar12 = ~*(uint *)(*(long *)(lVar20 + 0x20) + 0x14 + lVar19) >> 4 & 0x8000000;
                *(uint *)&this->data = uVar4 & 0xf7fbffff | uVar11 | uVar12;
                (this->data).xfb_buffer = *(uint *)(*(long *)(lVar20 + 0x20) + 0x18 + lVar19);
                uVar13 = (*(byte *)(*(long *)(lVar20 + 0x20) + 0x28 + lVar19) & 1) << 0x1a;
                *(uint *)&this->data = uVar4 & 0xf3fbffff | uVar11 | uVar12 | uVar13;
                uVar14 = (*(ushort *)(*(long *)(lVar20 + 0x20) + 0x20 + lVar19) & 3) << 0x10;
                *(uint *)&this->data = uVar4 & 0xf3f8ffff | uVar11 | uVar12 | uVar13 | uVar14;
                uVar15 = *(uint *)(*(long *)(lVar20 + 0x20) + 0x20 + lVar19) >> 2 & 2;
                *(uint *)&this->data =
                     uVar4 & 0xf3f8fffd | uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
                uVar16 = *(uint *)(*(long *)(lVar20 + 0x20) + 0x20 + lVar19) >> 2 & 4;
                *(uint *)&this->data =
                     uVar4 & 0xf3f8fff9 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16;
                uVar17 = *(uint *)(*(long *)(lVar20 + 0x20) + 0x20 + lVar19) >> 4 & 8;
                *(uint *)&this->data =
                     uVar4 & 0xf3f8fff1 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 |
                     uVar17;
                (this->data).stream = *(uint *)(ppeVar22 + 0xb);
                *(uint *)&this->data =
                     uVar4 & 0xf3f8f3f1 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 |
                     uVar17 | *(uint *)(ppeVar22 + 8) & 0xc00;
                puVar1 = &(this->data).field_0x4;
                *puVar1 = *puVar1 | 4;
                ir_variable::init_interface_type(this,(glsl_type *)ppeVar22[4]);
                _mesa_hash_table_insert(local_38,pcVar9,this);
                peVar21 = &(this->super_ir_instruction).super_exec_node;
                peVar6 = peVar8->next;
                (this->super_ir_instruction).super_exec_node.next = peVar6;
                (this->super_ir_instruction).super_exec_node.prev = peVar8;
                peVar6->prev = peVar21;
                peVar8->next = peVar21;
              }
              uVar23 = uVar23 + 1;
              lVar19 = lVar19 + 0x30;
              peVar8 = peVar21;
            } while (uVar23 < *(uint *)(lVar20 + 0xc));
          }
          lVar20 = (long)ppeVar22[1];
          plVar7 = (long *)ppeVar22[2];
          *(long **)(lVar20 + 8) = plVar7;
          *plVar7 = lVar20;
          ((exec_node *)(ppeVar22 + 1))->next = (exec_node *)0x0;
          ppeVar22[2] = (exec_node *)0x0;
        }
      }
      if (peVar5 == (exec_node *)0x0) break;
      peVar8 = ppeVar18[1];
      ppeVar22 = ppeVar18;
    }
  }
  visit_list_elements(&local_78,l,true);
  _mesa_hash_table_destroy(local_38,(_func_void_hash_entry_ptr *)0x0);
  return;
}

Assistant:

void
lower_named_interface_blocks(void *mem_ctx, gl_linked_shader *shader)
{
   flatten_named_interface_blocks_declarations v_decl(mem_ctx);
   v_decl.run(shader->ir);
}